

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_arange.c
# Opt level: O2

int dwarf_get_aranges(Dwarf_Debug dbg,Dwarf_Arange **aranges,Dwarf_Signed *returned_count,
                     Dwarf_Error *error)

{
  byte *pbVar1;
  byte *end_arange;
  byte bVar2;
  Dwarf_Unsigned DVar3;
  Dwarf_Chain pDVar4;
  byte *pbVar5;
  Dwarf_Error *error_00;
  int iVar6;
  ulong uVar7;
  char *pcVar8;
  Dwarf_Chain_conflict pDVar9;
  ulong uVar10;
  Dwarf_Signed errval;
  Dwarf_Unsigned DVar11;
  Dwarf_Unsigned DVar12;
  ulong uVar13;
  dwarfstring_u v;
  int readlength;
  Dwarf_Chain *ppDVar14;
  Dwarf_Chain_conflict head_chain;
  byte *local_d8;
  int local_length_size;
  Dwarf_Chain *local_c8;
  int local_extension_size;
  Dwarf_Error *local_b8;
  Dwarf_Unsigned local_b0;
  ulong local_a8;
  Dwarf_Unsigned area_length;
  Dwarf_Off info_offset;
  byte *local_90;
  Dwarf_Unsigned range_length;
  Dwarf_Unsigned version;
  Dwarf_Arange **local_78;
  Dwarf_Unsigned *local_70;
  byte *local_68;
  Dwarf_Unsigned local_60;
  ulong local_58;
  Dwarf_Addr range_address;
  
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: dbg argument to dwarf_get_aranges()either null or it containsa stale Dwarf_Debug pointer"
                       );
    return 1;
  }
  iVar6 = _dwarf_load_section(dbg,&dbg->de_debug_aranges,error);
  if (iVar6 != 0) {
    return iVar6;
  }
  iVar6 = _dwarf_load_debug_info(dbg,error);
  if (iVar6 != 0) {
    return iVar6;
  }
  version = 0;
  info_offset = 0;
  head_chain = (Dwarf_Chain_conflict)0x0;
  DVar3 = (dbg->de_debug_aranges).dss_size;
  if (DVar3 != 0) {
    local_d8 = (dbg->de_debug_aranges).dss_data;
    local_90 = local_d8 + DVar3;
    local_c8 = &head_chain;
    DVar11 = 0;
    local_70 = (Dwarf_Unsigned *)returned_count;
    local_68 = local_d8;
    local_60 = DVar3;
LAB_00149b7d:
    pbVar5 = local_d8;
    area_length = 0;
    local_extension_size = 0;
    if (local_90 <= local_d8) goto LAB_00149f04;
    iVar6 = _dwarf_read_area_length_ck_wrapper
                      (dbg,&area_length,&local_d8,&local_length_size,&local_extension_size,local_60,
                       local_90,error);
    if (iVar6 != 0) {
LAB_00149eef:
      free_aranges_chain(dbg,head_chain);
      goto LAB_00149f98;
    }
    uVar7 = (dbg->de_debug_aranges).dss_size;
    if (((area_length <= uVar7) &&
        ((long)local_extension_size + (long)local_length_size + area_length <= uVar7)) &&
       (end_arange = local_d8 + area_length, local_b0 = DVar11, end_arange <= local_90)) {
      pbVar1 = local_d8;
      if (area_length == 0) {
LAB_00149e9b:
        local_d8 = pbVar1;
        DVar3 = local_b0;
        pDVar9 = head_chain;
        DVar11 = local_b0;
        if (local_90 <= local_d8) goto code_r0x00149ec8;
        goto LAB_00149b7d;
      }
      iVar6 = _dwarf_read_unaligned_ck_wrapper(dbg,&version,local_d8,2,end_arange,error);
      if (iVar6 != 0) goto LAB_00149eef;
      local_d8 = local_d8 + 2;
      if (end_arange <= local_d8) goto LAB_00149f04;
      if (version != 2) {
        free_aranges_chain(dbg,head_chain);
        errval = 0x30;
        goto LAB_00149f8f;
      }
      iVar6 = _dwarf_read_unaligned_ck_wrapper
                        (dbg,&info_offset,local_d8,local_length_size,end_arange,error);
      if (iVar6 != 0) goto LAB_00149eef;
      local_d8 = local_d8 + local_length_size;
      if (local_d8 < end_arange) {
        pbVar1 = local_d8;
        if (info_offset < (dbg->de_debug_info).dss_size) {
          bVar2 = *local_d8;
          uVar7 = (ulong)bVar2;
          if (8 < bVar2) {
            free_aranges_chain(dbg,head_chain);
            errval = 0x32;
            goto LAB_00149f8f;
          }
          local_a8 = uVar7;
          if (uVar7 == 0) {
            free_aranges_chain(dbg,head_chain);
            errval = 0x173;
            goto LAB_00149f8f;
          }
          pbVar1 = local_d8 + 1;
          if (pbVar1 < end_arange) {
            if (*pbVar1 != 0) {
              local_d8 = pbVar1;
              free_aranges_chain(dbg,head_chain);
              _dwarf_error_string(dbg,error,0x87,
                                  "DW_DLE_SEGMENT_SIZE_BAD: segment selector size > 0 is not supported"
                                 );
              goto LAB_00149f94;
            }
            local_d8 = local_d8 + 2;
            pbVar1 = local_d8;
            if (local_d8 <= end_arange) {
              uVar13 = (ulong)((uint)bVar2 * 2);
              uVar10 = (ulong)((long)local_d8 - (long)pbVar5) % uVar13;
              local_b8 = error;
              local_78 = aranges;
              local_58 = uVar7;
              if (uVar10 != 0) {
                local_d8 = local_d8 + (uVar13 - uVar10);
              }
              do {
                error_00 = local_b8;
                range_address = 0;
                range_length = 0;
                readlength = (int)local_a8;
                iVar6 = _dwarf_read_unaligned_ck_wrapper
                                  (dbg,&range_address,local_d8,readlength,end_arange,local_b8);
                uVar7 = local_58;
                if (iVar6 != 0) goto LAB_00149eef;
                local_d8 = local_d8 + local_58;
                iVar6 = _dwarf_read_unaligned_ck_wrapper
                                  (dbg,&range_length,local_d8,readlength,end_arange,error_00);
                if (iVar6 != 0) goto LAB_00149eef;
                local_d8 = local_d8 + uVar7;
                pcVar8 = _dwarf_get_alloc(dbg,'\x11',1);
                if (pcVar8 == (char *)0x0) {
LAB_00149f26:
                  free_aranges_chain(dbg,head_chain);
                  errval = 0x3e;
                  error = local_b8;
                  goto LAB_00149f8f;
                }
                pcVar8[0] = '\0';
                pcVar8[1] = '\0';
                pcVar8[2] = '\0';
                pcVar8[3] = '\0';
                pcVar8[4] = '\0';
                pcVar8[5] = '\0';
                pcVar8[6] = '\0';
                pcVar8[7] = '\0';
                pcVar8[0x28] = '\0';
                pcVar8[0x29] = '\0';
                *(Dwarf_Addr *)(pcVar8 + 8) = range_address;
                *(Dwarf_Unsigned *)(pcVar8 + 0x10) = range_length;
                *(Dwarf_Off *)(pcVar8 + 0x18) = info_offset;
                *(Dwarf_Debug *)(pcVar8 + 0x20) = dbg;
                pDVar9 = (Dwarf_Chain_conflict)_dwarf_get_alloc(dbg,'\x1f',1);
                if (pDVar9 == (Dwarf_Chain_conflict)0x0) {
                  dwarf_dealloc(dbg,pcVar8,0x11);
                  goto LAB_00149f26;
                }
                local_b0 = local_b0 + 1;
                pDVar9->ch_item = pcVar8;
                pDVar9->ch_itemtype = 0x11;
                *local_c8 = pDVar9;
                error = local_b8;
                ppDVar14 = &pDVar9->ch_next;
                local_c8 = ppDVar14;
              } while (local_d8 + uVar13 <= end_arange);
              aranges = local_78;
              pbVar1 = end_arange;
              if (end_arange < local_d8) {
                local_c8 = (Dwarf_Chain *)((long)local_d8 - (long)end_arange);
                v = (long)local_d8 - (long)local_68;
                dwarfstring_constructor((dwarfstring_s *)&range_address);
                dwarfstring_append_printf_u
                          ((dwarfstring_s *)&range_address,"DW_DLE_ARANGE_LENGTH_BAD. 0x%08llx",
                           (dwarfstring_u)local_c8);
                dwarfstring_append_printf_u
                          ((dwarfstring_s *)&range_address,
                           " pad bytes at offset 0x%08llx in .debug_aranges",v);
                pcVar8 = dwarfstring_string((dwarfstring_s *)&range_address);
                dwarf_insert_harmless_error(dbg,pcVar8);
                dwarfstring_destructor((dwarfstring_s *)&range_address);
                aranges = local_78;
                local_c8 = ppDVar14;
              }
              goto LAB_00149e9b;
            }
          }
        }
        local_d8 = pbVar1;
        free_aranges_chain(dbg,head_chain);
        errval = 0x86;
        goto LAB_00149f8f;
      }
    }
LAB_00149f04:
    free_aranges_chain(dbg,head_chain);
    errval = 0x14f;
    goto LAB_00149f8f;
  }
  iVar6 = -1;
LAB_00149f98:
  free_aranges_chain(dbg,(Dwarf_Chain_conflict)0x0);
  return iVar6;
code_r0x00149ec8:
  if (local_d8 == local_90) {
    local_c8 = (Dwarf_Chain *)_dwarf_get_alloc(dbg,'\x0f',local_b0);
    if ((Dwarf_Arange *)local_c8 == (Dwarf_Arange *)0x0) {
      _dwarf_error(dbg,error,0x3e);
      free_aranges_chain(dbg,pDVar9);
      return 1;
    }
    DVar12 = 0;
    DVar11 = 0;
    if (0 < (long)DVar3) {
      DVar11 = DVar3;
    }
    for (; DVar11 != DVar12; DVar12 = DVar12 + 1) {
      local_c8[DVar12] = (Dwarf_Chain)pDVar9->ch_item;
      pDVar9->ch_item = (void *)0x0;
      pDVar4 = pDVar9->ch_next;
      dwarf_dealloc(dbg,pDVar9,0x1f);
      pDVar9 = pDVar4;
    }
    *aranges = (Dwarf_Arange *)local_c8;
    *local_70 = local_b0;
    return 0;
  }
  free_aranges_chain(dbg,head_chain);
  errval = 0x89;
LAB_00149f8f:
  _dwarf_error(dbg,error,errval);
LAB_00149f94:
  iVar6 = 1;
  goto LAB_00149f98;
}

Assistant:

int
dwarf_get_aranges(Dwarf_Debug dbg,
    Dwarf_Arange ** aranges,
    Dwarf_Signed * returned_count, Dwarf_Error * error)
{
    /* Count of total number of aranges. */
    Dwarf_Signed arange_count = 0;

    Dwarf_Arange *arange_block = 0;

    /* Used to chain Dwarf_Aranges structs. */
    Dwarf_Chain curr_chain = NULL;
    Dwarf_Chain head_chain = NULL;
    Dwarf_Signed i = 0;
    int res = DW_DLV_ERROR;

    /* ***** BEGIN CODE ***** */

    CHECK_DBG(dbg,error,"dwarf_get_aranges()");
    res = _dwarf_load_section(dbg, &dbg->de_debug_aranges, error);
    if (res != DW_DLV_OK) {
        return res;
    }
    /*  aranges points in to info, so if info needs expanding
        we have to load it. */
    res = _dwarf_load_debug_info(dbg, error);
    if (res != DW_DLV_OK) {
        return res;
    }

    res = _dwarf_get_aranges_list(dbg,&head_chain,
        &arange_count,error);
    if (res != DW_DLV_OK) {
        free_aranges_chain(dbg,head_chain);
        return res;
    }

    arange_block = (Dwarf_Arange *)
        _dwarf_get_alloc(dbg, DW_DLA_LIST, arange_count);
    if (arange_block == NULL) {
        _dwarf_error(dbg, error, DW_DLE_ALLOC_FAIL);
        free_aranges_chain(dbg,head_chain);
        return DW_DLV_ERROR;
    }

    /* See also free_aranges_chain() above */
    curr_chain = head_chain;
    for (i = 0; i < arange_count; i++) {
        Dwarf_Chain prev = 0;

        /*  Copies pointers. No dealloc of ch_item, */
        *(arange_block + i) = curr_chain->ch_item;
        curr_chain->ch_item = 0;
        prev = curr_chain;
        curr_chain = curr_chain->ch_next;
        dwarf_dealloc(dbg, prev, DW_DLA_CHAIN);
    }
    *aranges = arange_block;
    *returned_count = (arange_count);
    return DW_DLV_OK;
}